

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_Examples_Test::TestBody(FormatterTest_Examples_Test *this)

{
  bool bVar1;
  AssertionResult *pAVar2;
  char (*in_RCX) [6];
  char *pcVar3;
  int *args;
  wchar_t *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_3;
  char local_149;
  OutputRedirect gtest_redir;
  char buffer [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  fmt::v5::format<char[31],char[6]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"First, thou shalt count to {0}",(char (*) [31])0x1f0ad0,in_RCX);
  pcVar3 = "First, thou shalt count to three";
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"First, thou shalt count to three\"",
             "format(\"First, thou shalt count to {0}\", \"three\")",
             (char (*) [33])"First, thou shalt count to three",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x695;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x695,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer;
  fmt::v5::format<char[14],char[10]>
            (pbVar4,(v5 *)"Bring me a {}",(char (*) [14])0x1f0b3c,(char (*) [10])pcVar3);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Bring me a shrubbery\"",
             "format(\"Bring me a {}\", \"shrubbery\")",(char (*) [21])"Bring me a shrubbery",pbVar4
            );
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x697,(char *)pbVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_3._0_4_ = 1;
  gtest_ar_20._0_4_ = 3;
  fmt::v5::format<char[14],int,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"From {} to {}",&gtest_ar_3.success_,(int *)&gtest_ar_20,(int *)pbVar4);
  pcVar3 = "From 1 to 3";
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"From 1 to 3\"","format(\"From {} to {}\", 1, 3)",
             (char (*) [12])"From 1 to 3",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x698;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x698,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  safe_sprintf<256ul>(&buffer,"%03.2f",0xbff3333333333333);
  gtest_ar_20.success_ = true;
  gtest_ar_20._1_7_ = 0xbff33333333333;
  fmt::v5::format<char[9],double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:03.2f}",&gtest_ar_20.success_,(double *)pcVar3);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"buffer","format(\"{:03.2f}\", -1.2)",&buffer,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x69c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20.success_ = true;
  gtest_redir.file_ = (FILE *)CONCAT71(gtest_redir.file_._1_7_,0x62);
  local_149 = 'c';
  fmt::v5::format<char[14],char,char,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{0}, {1}, {2}",&gtest_ar_20.success_,(char *)&gtest_redir,&local_149,in_R9);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"a, b, c\"","format(\"{0}, {1}, {2}\", \'a\', \'b\', \'c\')",
             (char (*) [8])"a, b, c",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x69e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20.success_ = true;
  gtest_redir.file_ = (FILE *)CONCAT71(gtest_redir.file_._1_7_,0x62);
  local_149 = 'c';
  fmt::v5::format<char[11],char,char,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{}, {}, {}",&gtest_ar_20.success_,(char *)&gtest_redir,&local_149,in_R9);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"a, b, c\"","format(\"{}, {}, {}\", \'a\', \'b\', \'c\')",
             (char (*) [8])"a, b, c",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x69f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20.success_ = true;
  gtest_redir.file_ = (FILE *)CONCAT71(gtest_redir.file_._1_7_,0x62);
  local_149 = 'c';
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  fmt::v5::format<char[14],char,char,char>
            (pbVar4,(v5 *)"{2}, {1}, {0}",&gtest_ar_20.success_,(char *)&gtest_redir,&local_149,
             in_R9);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"c, b, a\"","format(\"{2}, {1}, {0}\", \'a\', \'b\', \'c\')",
             (char (*) [8])"c, b, a",pbVar4);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6a0,(char *)pbVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  fmt::v5::format<char[10],char[5],char[4]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{0}{1}{0}",(char (*) [10])0x1e56f8,(char (*) [5])"cad",(char (*) [4])pbVar4);
  pcVar3 = "abracadabra";
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"abracadabra\"","format(\"{0}{1}{0}\", \"abra\", \"cad\")",
             (char (*) [12])"abracadabra",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6a1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6a1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  fmt::v5::format<char[7],char[13]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:<30}",(char (*) [7])"left aligned",(char (*) [13])pcVar3);
  pcVar3 = "left aligned                  ";
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"left aligned                  \"",
             "format(\"{:<30}\", \"left aligned\")",(char (*) [31])"left aligned                  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6a4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6a4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  fmt::v5::format<char[7],char[14]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:>30}",(char (*) [7])0x1f0d49,(char (*) [14])pcVar3);
  pcVar3 = "                 right aligned";
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"                 right aligned\"",
             "format(\"{:>30}\", \"right aligned\")",(char (*) [31])"                 right aligned"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6a6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6a6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  fmt::v5::format<char[7],char[9]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:^30}",(char (*) [7])"centered",(char (*) [9])pcVar3);
  pcVar3 = "           centered           ";
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"           centered           \"",
             "format(\"{:^30}\", \"centered\")",(char (*) [31])"           centered           ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6a8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6a8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  fmt::v5::format<char[8],char[9]>
            (pbVar4,(v5 *)"{:*^30}",(char (*) [8])"centered",(char (*) [9])pcVar3);
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"***********centered***********\"",
             "format(\"{:*^30}\", \"centered\")",(char (*) [31])"***********centered***********",
             pbVar4);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6aa,(char *)pbVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20.success_ = true;
  gtest_ar_20._1_7_ = 0x40091eb851eb85;
  gtest_redir.file_ = (FILE *)0xc0091eb851eb851f;
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  fmt::v5::format<char[13],double,double>
            (__return_storage_ptr__,(v5 *)"{:+f}; {:+f}",&gtest_ar_20.success_,
             (double *)&gtest_redir,(double *)pbVar4);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"+3.140000; -3.140000\"",
             "format(\"{:+f}; {:+f}\", 3.14, -3.14)",(char (*) [21])"+3.140000; -3.140000",
             __return_storage_ptr__);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6ad,(char *)__return_storage_ptr__);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20.success_ = true;
  gtest_ar_20._1_7_ = 0x40091eb851eb85;
  gtest_redir.file_ = (FILE *)0xc0091eb851eb851f;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  fmt::v5::format<char[13],double,double>
            (pbVar4,(v5 *)"{: f}; {: f}",&gtest_ar_20.success_,(double *)&gtest_redir,
             (double *)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\" 3.140000; -3.140000\"",
             "format(\"{: f}; {: f}\", 3.14, -3.14)",(char (*) [21])" 3.140000; -3.140000",pbVar4);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6af,(char *)pbVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20.success_ = true;
  gtest_ar_20._1_7_ = 0x40091eb851eb85;
  gtest_redir.file_ = (FILE *)0xc0091eb851eb851f;
  fmt::v5::format<char[13],double,double>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"{:-f}; {:-f}",&gtest_ar_20.success_,(double *)&gtest_redir,(double *)pbVar4);
  args = (int *)0x1f0eca;
  testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"3.140000; -3.140000\"",
             "format(\"{:-f}; {:-f}\", 3.14, -3.14)",(char (*) [20])0x1f0eca,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    args = (int *)0x6b1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20._0_4_ = 0x2a;
  fmt::v5::format<char[37],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"int: {0:d};  hex: {0:x};  oct: {0:o}",&gtest_ar_20.success_,args);
  pcVar3 = "int: 42;  hex: 2a;  oct: 52";
  testing::internal::CmpHelperEQ<char[28],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"int: 42;  hex: 2a;  oct: 52\"",
             "format(\"int: {0:d};  hex: {0:x};  oct: {0:o}\", 42)",
             (char (*) [28])"int: 42;  hex: 2a;  oct: 52",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6b4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6b4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20._0_4_ = 0x2a;
  fmt::v5::format<char[39],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"int: {0:d};  hex: {0:#x};  oct: {0:#o}",&gtest_ar_20.success_,(int *)pcVar3);
  pcVar3 = "int: 42;  hex: 0x2a;  oct: 052";
  testing::internal::CmpHelperEQ<char[31],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"int: 42;  hex: 0x2a;  oct: 052\"",
             "format(\"int: {0:d};  hex: {0:#x};  oct: {0:#o}\", 42)",
             (char (*) [31])"int: 42;  hex: 0x2a;  oct: 052",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6b6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6b6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20._0_4_ = 0x2a;
  fmt::v5::format<char[17],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)"The answer is {}",&gtest_ar_20.success_,(int *)pcVar3);
  pcVar3 = "The answer is 42";
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar_3,"\"The answer is 42\"","format(\"The answer is {}\", 42)",
             (char (*) [17])"The answer is 42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x6b8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6b8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  testing::AssertionSuccess();
  if (gtest_ar_3.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_ar,"invalid type specifier",(allocator *)&gtest_ar_20);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[19],char[10]>
                (&local_38,(v5 *)"The answer is {:d}",(char (*) [19])"forty-two",
                 (char (*) [10])pcVar3);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_3,
               (char (*) [123])
               "Expected: format(\"The answer is {:d}\", \"forty-two\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_3.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_00 = (wchar_t *)0x6bb;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x6bb,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_20._0_4_ = 0x42e;
  fmt::v5::format<wchar_t[19],wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
             ,(v5 *)L"Cyrillic letter {}",(wchar_t (*) [19])&gtest_ar_20,args_00);
  testing::internal::CmpHelperEQ<wchar_t[18],std::__cxx11::wstring>
            ((internal *)&gtest_ar_3,"L\"Cyrillic letter \\x42e\"",
             "format(L\"Cyrillic letter {}\", L\'\\x42e\')",(wchar_t (*) [18])L"Cyrillic letter Ю",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
            );
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x6be,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  testing::AssertionSuccess();
  if (gtest_ar_20.success_ == true) {
    std::__cxx11::string::string((string *)&gtest_ar,"inf",(allocator *)&gtest_ar_3);
    OutputRedirect::OutputRedirect(&gtest_redir,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      gtest_ar_3.success_ = false;
      gtest_ar_3._1_7_ = 0x7ff00000000000;
      fmt::v5::print<char[3],double>((char (*) [3])0x1f0c36,(double *)&gtest_ar_3);
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)&gtest_ar_3,&gtest_redir);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar_3,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&gtest_ar_3);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_ar);
      goto LAB_00144681;
    }
    pAVar2 = testing::AssertionResult::operator<<
                       (&gtest_ar_20,
                        (char (*) [86])
                        "fmt::print(\"{}\", std::numeric_limits<double>::infinity()) produces different output.\n"
                       );
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e15);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e09);
    testing::AssertionResult::operator<<
              (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &gtest_ar_3);
    std::__cxx11::string::~string((string *)&gtest_ar_3);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_20.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar_20.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x6c1,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
LAB_00144681:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_20.message_);
  return;
}

Assistant:

TEST(FormatterTest, Examples) {
  EXPECT_EQ("First, thou shalt count to three",
      format("First, thou shalt count to {0}", "three"));
  EXPECT_EQ("Bring me a shrubbery",
      format("Bring me a {}", "shrubbery"));
  EXPECT_EQ("From 1 to 3", format("From {} to {}", 1, 3));

  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%03.2f", -1.2);
  EXPECT_EQ(buffer, format("{:03.2f}", -1.2));

  EXPECT_EQ("a, b, c", format("{0}, {1}, {2}", 'a', 'b', 'c'));
  EXPECT_EQ("a, b, c", format("{}, {}, {}", 'a', 'b', 'c'));
  EXPECT_EQ("c, b, a", format("{2}, {1}, {0}", 'a', 'b', 'c'));
  EXPECT_EQ("abracadabra", format("{0}{1}{0}", "abra", "cad"));

  EXPECT_EQ("left aligned                  ",
      format("{:<30}", "left aligned"));
  EXPECT_EQ("                 right aligned",
      format("{:>30}", "right aligned"));
  EXPECT_EQ("           centered           ",
      format("{:^30}", "centered"));
  EXPECT_EQ("***********centered***********",
      format("{:*^30}", "centered"));

  EXPECT_EQ("+3.140000; -3.140000",
      format("{:+f}; {:+f}", 3.14, -3.14));
  EXPECT_EQ(" 3.140000; -3.140000",
      format("{: f}; {: f}", 3.14, -3.14));
  EXPECT_EQ("3.140000; -3.140000",
      format("{:-f}; {:-f}", 3.14, -3.14));

  EXPECT_EQ("int: 42;  hex: 2a;  oct: 52",
      format("int: {0:d};  hex: {0:x};  oct: {0:o}", 42));
  EXPECT_EQ("int: 42;  hex: 0x2a;  oct: 052",
      format("int: {0:d};  hex: {0:#x};  oct: {0:#o}", 42));

  EXPECT_EQ("The answer is 42", format("The answer is {}", 42));
  EXPECT_THROW_MSG(
    format("The answer is {:d}", "forty-two"), format_error,
    "invalid type specifier");

  EXPECT_EQ(L"Cyrillic letter \x42e",
    format(L"Cyrillic letter {}", L'\x42e'));

  EXPECT_WRITE(stdout,
      fmt::print("{}", std::numeric_limits<double>::infinity()), "inf");
}